

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int function_addrs_search(void *vkey,void *ventry)

{
  uintptr_t pc;
  function_addrs *entry;
  uintptr_t *key;
  void *ventry_local;
  void *vkey_local;
  undefined4 local_4;
  
  if (*vkey < *ventry) {
    local_4 = -1;
  }
  else if (*(ulong *)((long)ventry + 0x18) < *vkey) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
function_addrs_search (const void *vkey, const void *ventry)
{
  const uintptr_t *key = (const uintptr_t *) vkey;
  const struct function_addrs *entry = (const struct function_addrs *) ventry;
  uintptr_t pc;

  pc = *key;
  if (pc < entry->low)
    return -1;
  else if (pc > (entry + 1)->low)
    return 1;
  else
    return 0;
}